

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

ProgramSources * __thiscall
deqp::gles31::Functional::anon_unknown_1::BasicTriangleFillNonOverlapCase::makeSources
          (ProgramSources *__return_storage_ptr__,BasicTriangleFillNonOverlapCase *this,
          TessPrimitiveType primitiveType,SpacingMode spacing,char *vtxOutPosAttrName)

{
  pointer *ppbVar1;
  long *plVar2;
  size_type *psVar3;
  size_type *psVar4;
  pointer pbVar5;
  ContextInfo *pCVar6;
  Context *code;
  undefined1 usePointMode;
  long lVar7;
  string tessellationEvaluationTemplate;
  string vertexShaderTemplate;
  string fragmentShaderTemplate;
  size_type *local_238;
  value_type local_230;
  size_type *local_210;
  value_type local_208;
  undefined1 local_1e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  Context *local_1c0;
  long local_1b8;
  Context local_1b0;
  long local_198;
  undefined1 local_190 [16];
  ContextInfo *local_180;
  undefined1 local_170 [24];
  pointer local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  string local_140;
  undefined1 local_120 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  long lStack_e8;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> vStack_70;
  deUint32 local_58;
  undefined1 local_50 [24];
  bool local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1e8,vtxOutPosAttrName,(allocator<char> *)&local_1c0);
  usePointMode = 0x43;
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_1e8,0,(char *)0x0,0x9543f9);
  local_238 = &local_230._M_string_length;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar3) {
    local_230._M_string_length = *psVar3;
    local_230.field_2._M_allocated_capacity = plVar2[3];
  }
  else {
    local_230._M_string_length = *psVar3;
    local_238 = (size_type *)*plVar2;
  }
  local_230._M_dataplus._M_p = (pointer)plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_238);
  psVar3 = &local_208._M_string_length;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    local_208._M_string_length = *psVar4;
    local_208.field_2._M_allocated_capacity = plVar2[3];
    local_210 = psVar3;
  }
  else {
    local_208._M_string_length = *psVar4;
    local_210 = (size_type *)*plVar2;
  }
  local_208._M_dataplus._M_p = (pointer)plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_210);
  ppbVar1 = (pointer *)
            ((long)&local_100.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl + 0x10);
  pbVar5 = (pointer)(plVar2 + 2);
  if ((pointer)*plVar2 == pbVar5) {
    local_100.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar5->_M_dataplus)._M_p;
    lStack_e8 = plVar2[3];
    local_100.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
  }
  else {
    local_100.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar5->_M_dataplus)._M_p;
    local_100.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar2;
  }
  local_100.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar2[1];
  *plVar2 = (long)pbVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_100);
  local_1b0.m_contextInfo = (ContextInfo *)local_190;
  pCVar6 = (ContextInfo *)(plVar2 + 2);
  if ((ContextInfo *)*plVar2 == pCVar6) {
    local_190._0_8_ = pCVar6->_vptr_ContextInfo;
    local_190._8_8_ = plVar2[3];
  }
  else {
    local_190._0_8_ = pCVar6->_vptr_ContextInfo;
    local_1b0.m_contextInfo = (ContextInfo *)*plVar2;
  }
  local_198 = plVar2[1];
  *plVar2 = (long)pCVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_100.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
    operator_delete(local_100.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_100.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_210 != psVar3) {
    operator_delete(local_210,local_208._M_string_length + 1);
  }
  if (local_238 != &local_230._M_string_length) {
    operator_delete(local_238,local_230._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_1e8._4_4_,local_1e8._0_4_) != &local_1d8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_1e8._4_4_,local_1e8._0_4_),local_1d8._M_allocated_capacity + 1
                   );
  }
  (anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
            ((string *)local_1e8,(_anonymous_namespace_ *)(ulong)primitiveType,spacing,
             SPACINGMODE_EQUAL,(bool)usePointMode);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_1e8,0,(char *)0x0,0x9521e9);
  local_238 = &local_230._M_string_length;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    local_230._M_string_length = *psVar4;
    local_230.field_2._M_allocated_capacity = plVar2[3];
  }
  else {
    local_230._M_string_length = *psVar4;
    local_238 = (size_type *)*plVar2;
  }
  local_230._M_dataplus._M_p = (pointer)plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_238);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    local_208._M_string_length = *psVar4;
    local_208.field_2._M_allocated_capacity = plVar2[3];
    local_210 = psVar3;
  }
  else {
    local_208._M_string_length = *psVar4;
    local_210 = (size_type *)*plVar2;
  }
  local_208._M_dataplus._M_p = (pointer)plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_210);
  pbVar5 = (pointer)(plVar2 + 2);
  if ((pointer)*plVar2 == pbVar5) {
    local_100.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar5->_M_dataplus)._M_p;
    lStack_e8 = plVar2[3];
    local_100.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
  }
  else {
    local_100.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar5->_M_dataplus)._M_p;
    local_100.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar2;
  }
  local_100.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar2[1];
  *plVar2 = (long)pbVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_100);
  local_1c0 = &local_1b0;
  code = (Context *)(plVar2 + 2);
  if ((Context *)*plVar2 == code) {
    local_1b0.m_testCtx = code->m_testCtx;
    local_1b0.m_renderCtx = (RenderContext *)plVar2[3];
  }
  else {
    local_1b0.m_testCtx = code->m_testCtx;
    local_1c0 = (Context *)*plVar2;
  }
  local_1b8 = plVar2[1];
  *plVar2 = (long)code;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_100.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
    operator_delete(local_100.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_100.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_210 != psVar3) {
    operator_delete(local_210,local_208._M_string_length + 1);
  }
  if (local_238 != &local_230._M_string_length) {
    operator_delete(local_238,local_230._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_1e8._4_4_,local_1e8._0_4_) != &local_1d8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_1e8._4_4_,local_1e8._0_4_),local_1d8._M_allocated_capacity + 1
                   );
  }
  local_180 = (ContextInfo *)local_170;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_180,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin mediump vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
             ,"");
  memset(&local_100,0,0xac);
  local_50._0_8_ = (pointer)0x0;
  local_50[8] = 0;
  local_50._9_7_ = 0;
  local_50[0x10] = 0;
  stack0xffffffffffffffc1 = 0;
  (anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)local_120,
             (_anonymous_namespace_ *)
             ((this->super_BasicVariousTessLevelsPosAttrCase).super_TestCase.m_context)->m_renderCtx
             ,(Context *)local_1b0.m_contextInfo,(char *)code);
  local_210 = (size_type *)((ulong)local_210 & 0xffffffff00000000);
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_120._0_8_,(pointer)(local_120._0_8_ + local_120._8_8_));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_100 + ((ulong)local_210 & 0xffffffff),&local_208);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_140,
             (_anonymous_namespace_ *)
             ((this->super_BasicVariousTessLevelsPosAttrCase).super_TestCase.m_context)->m_renderCtx
             ,local_1c0,(char *)code);
  local_238 = (size_type *)CONCAT44(local_238._4_4_,4);
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,local_140._M_dataplus._M_p,
             local_140._M_dataplus._M_p + local_140._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_100 + ((ulong)local_238 & 0xffffffff),&local_230);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)(local_170 + 0x10),
             (_anonymous_namespace_ *)
             ((this->super_BasicVariousTessLevelsPosAttrCase).super_TestCase.m_context)->m_renderCtx
             ,(Context *)local_180,(char *)code);
  local_1e8._0_4_ = 1;
  local_1e8._8_8_ = local_1d8._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_1e8 + 8),local_170._16_8_,
             (char *)(local_170._16_8_ + (long)&local_158->_M_dataplus));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_100 + (uint)local_1e8._0_4_,(value_type *)(local_1e8 + 8));
  lVar7 = 0;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&__return_storage_ptr__->sources[0].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar7),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&local_100.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + lVar7));
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x90);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::vector
            (&__return_storage_ptr__->attribLocationBindings,&vStack_70);
  __return_storage_ptr__->transformFeedbackBufferMode = local_58;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&__return_storage_ptr__->transformFeedbackVaryings,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_50);
  __return_storage_ptr__->separable = local_38;
  if ((char *)local_1e8._8_8_ != local_1d8._M_local_buf + 8) {
    operator_delete((void *)local_1e8._8_8_,local_1d8._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._16_8_ != &local_150) {
    operator_delete((void *)local_170._16_8_,(ulong)(local_150._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,(ulong)(local_140.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((_Base_ptr)local_120._0_8_ != (_Base_ptr)(local_120 + 0x10)) {
    operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&vStack_70);
  lVar7 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_100.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar7));
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != -0x18);
  if (local_180 != (ContextInfo *)local_170) {
    operator_delete(local_180,(ulong)((long)&((_Alloc_hider *)local_170._0_8_)->_M_p + 1));
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,(ulong)((long)&(local_1b0.m_testCtx)->m_platform + 1));
  }
  if (local_1b0.m_contextInfo != (ContextInfo *)local_190) {
    operator_delete(local_1b0.m_contextInfo,(ulong)((long)(Platform **)local_190._0_8_ + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

const glu::ProgramSources makeSources (TessPrimitiveType primitiveType, SpacingMode spacing, const char* vtxOutPosAttrName) const
	{
		std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "in highp vec2 in_v_position;\n"
													 "\n"
													 "out highp vec2 " + string(vtxOutPosAttrName) + ";\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	" + vtxOutPosAttrName + " = in_v_position;\n"
													 "}\n");
		std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
													 "${TESSELLATION_SHADER_REQUIRE}\n"
													 "\n"
													 + getTessellationEvaluationInLayoutString(primitiveType, spacing) +
													 "\n"
													 "in highp vec2 in_te_position[];\n"
													 "\n"
													 "out mediump vec4 in_f_color;\n"
													 "\n"
													 "uniform mediump float u_tessLevelInner0;\n"
													 "uniform mediump float u_tessLevelInner1;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 + (primitiveType == TESSPRIMITIVETYPE_TRIANGLES ?
														"\n"
														"	highp vec2 corner0 = in_te_position[0];\n"
														"	highp vec2 corner1 = in_te_position[1];\n"
														"	highp vec2 corner2 = in_te_position[2];\n"
														"	highp vec2 pos =  corner0*gl_TessCoord.x + corner1*gl_TessCoord.y + corner2*gl_TessCoord.z;\n"
														"	gl_Position = vec4(pos, 0.0, 1.0);\n"
														"	highp int numConcentricTriangles = int(round(u_tessLevelInner0)) / 2 + 1;\n"
														"	highp float d = 3.0 * min(gl_TessCoord.x, min(gl_TessCoord.y, gl_TessCoord.z));\n"
														"	highp int phase = int(d*float(numConcentricTriangles)) % 3;\n"
														"	in_f_color = phase == 0 ? vec4(1.0, 0.0, 0.0, 1.0)\n"
														"	           : phase == 1 ? vec4(0.0, 1.0, 0.0, 1.0)\n"
														"	           :              vec4(0.0, 0.0, 1.0, 1.0);\n"
													  : primitiveType == TESSPRIMITIVETYPE_QUADS ?
														"	highp vec2 corner0 = in_te_position[0];\n"
														"	highp vec2 corner1 = in_te_position[1];\n"
														"	highp vec2 corner2 = in_te_position[2];\n"
														"	highp vec2 corner3 = in_te_position[3];\n"
														"	highp vec2 pos = (1.0-gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner0\n"
														"	               + (    gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner1\n"
														"	               + (1.0-gl_TessCoord.x)*(    gl_TessCoord.y)*corner2\n"
														"	               + (    gl_TessCoord.x)*(    gl_TessCoord.y)*corner3;\n"
														"	gl_Position = vec4(pos, 0.0, 1.0);\n"
														"	highp int phaseX = int(round((0.5 - abs(gl_TessCoord.x-0.5)) * u_tessLevelInner0));\n"
														"	highp int phaseY = int(round((0.5 - abs(gl_TessCoord.y-0.5)) * u_tessLevelInner1));\n"
														"	highp int phase = min(phaseX, phaseY) % 3;\n"
														"	in_f_color = phase == 0 ? vec4(1.0, 0.0, 0.0, 1.0)\n"
														"	           : phase == 1 ? vec4(0.0, 1.0, 0.0, 1.0)\n"
														"	           :              vec4(0.0, 0.0, 1.0, 1.0);\n"
													  : DE_NULL) +
													 "}\n");
		std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "layout (location = 0) out mediump vec4 o_color;\n"
													 "\n"
													 "in mediump vec4 in_f_color;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	o_color = in_f_color;\n"
													 "}\n");

		return glu::ProgramSources()
			<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
			<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
			<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()));
	}